

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O0

bool TTD::NSLogEvents::JsRTCallFunctionAction_GetLastExecutedStatementAndFrameInfoForDebugger
               (EventLogEntry *evt,TTDebuggerSourceLocation *lastSourceInfo)

{
  bool bVar1;
  JsRTCallFunctionAction *pJVar2;
  JsRTCallFunctionAction *cfAction;
  TTDebuggerSourceLocation *lastSourceInfo_local;
  EventLogEntry *evt_local;
  
  pJVar2 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTCallFunctionAction,(TTD::NSLogEvents::EventKind)68>
                     (evt);
  bVar1 = TTDebuggerSourceLocation::HasValue(&pJVar2->AdditionalReplayInfo->LastExecutedLocation);
  if (bVar1) {
    TTDebuggerSourceLocation::SetLocationCopy
              (lastSourceInfo,&pJVar2->AdditionalReplayInfo->LastExecutedLocation);
  }
  else {
    TTDebuggerSourceLocation::Clear(lastSourceInfo);
  }
  return bVar1;
}

Assistant:

bool JsRTCallFunctionAction_GetLastExecutedStatementAndFrameInfoForDebugger(const EventLogEntry* evt, TTDebuggerSourceLocation& lastSourceInfo)
        {
            const JsRTCallFunctionAction* cfAction = GetInlineEventDataAs<JsRTCallFunctionAction, EventKind::CallExistingFunctionActionTag>(evt);
            if(cfAction->AdditionalReplayInfo->LastExecutedLocation.HasValue())
            {
                lastSourceInfo.SetLocationCopy(cfAction->AdditionalReplayInfo->LastExecutedLocation);
                return true;
            }
            else
            {
                lastSourceInfo.Clear();
                return false;
            }
        }